

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integer.c
# Opt level: O1

int64_t sysbvm_tuple_integer_decodeInt64(sysbvm_context_t *context,sysbvm_tuple_t value)

{
  sysbvm_tuple_t sVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  
  if ((value & 0xf) != 0) {
    return (long)value >> 4;
  }
  if (value == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = *(uint *)(value + 0xc);
  }
  if (uVar3 < 4) {
    uVar2 = 0;
  }
  else {
    uVar4 = (ulong)*(uint *)(value + 0x10);
    if (7 < uVar3) {
      uVar4 = CONCAT44(*(undefined4 *)(value + 0x14),*(uint *)(value + 0x10));
    }
    if (value == 0) {
      sVar1 = sysbvm_tuple_getImmediateTypeWithTag(context,0);
    }
    else {
      sVar1 = *(sysbvm_tuple_t *)value;
    }
    uVar2 = -uVar4;
    if (sVar1 != (context->roots).largeNegativeIntegerType) {
      uVar2 = uVar4;
    }
  }
  return uVar2;
}

Assistant:

int64_t sysbvm_tuple_integer_decodeInt64(sysbvm_context_t *context, sysbvm_tuple_t value)
{
    if(sysbvm_tuple_isImmediate(value))
        return sysbvm_tuple_integer_decodeSmall(value);

    size_t byteSize = sysbvm_tuple_getSizeInBytes(value);
    if(byteSize < 4)
        return 0;

    sysbvm_integer_t *integer = (sysbvm_integer_t *)value;
    int64_t decodedValue = 0;
    if(byteSize >= 8)
        decodedValue = (uint64_t)integer->words[0] | ((uint64_t)integer->words[1] << 32);
    else
        decodedValue = (uint64_t)integer->words[0];
    
    if(sysbvm_tuple_getType(context, value) == context->roots.largeNegativeIntegerType)
        decodedValue = -decodedValue;
    return decodedValue;
}